

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O3

void capnp::_::anon_unknown_0::checkStruct(StructReader reader)

{
  long lVar1;
  ushort uVar2;
  char cVar3;
  undefined1 uVar4;
  short sVar5;
  undefined2 uVar6;
  int iVar7;
  byte bVar8;
  undefined4 uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int i;
  ElementCount index;
  ulong uVar13;
  bool bVar14;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  uint local_f8;
  StructPointerCount local_f4;
  int local_f0;
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition;
  uint local_b0;
  StructPointerCount local_aa;
  Fault f;
  uint local_88;
  PointerReader local_78;
  DebugComparison<int,_int> _kjCondition_15;
  uint local_34;
  
  if (reader.dataSize < 0x40) {
    _kjCondition.right = 0;
  }
  else {
    _kjCondition.right = *reader.data;
  }
  _kjCondition.left = 0x1011121314151617;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x1011121314151617;
  if ((_kjCondition.right != 0x1011121314151617) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_8.left = 0x14151617;
    _kjCondition_8.right = 0x10111213;
    if (reader.dataSize < 0x40) {
      f.exception = (Exception *)0x0;
    }
    else {
      f.exception = *reader.data;
    }
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xea,ERROR,
               "\"failed: expected \" \"(0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", _kjCondition, 0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
               ,(char (*) [90])
                "failed: expected (0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
               ,&_kjCondition,(unsigned_long_long *)&_kjCondition_8,(unsigned_long *)&f);
  }
  iVar7 = 0;
  if (0x5f < reader.dataSize) {
    iVar7 = *(int *)((long)reader.data + 8);
  }
  _kjCondition.left = CONCAT44(iVar7,0x20212223);
  _kjCondition.right = (unsigned_long)anon_var_dwarf_a914;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == 0x20212223);
  if ((iVar7 != 0x20212223) && (kj::_::Debug::minSeverity < 3)) {
    uVar9 = 0;
    _kjCondition_8.left = 0x20212223;
    if (0x5f < reader.dataSize) {
      uVar9 = *(undefined4 *)((long)reader.data + 8);
    }
    f.exception._0_4_ = uVar9;
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xeb,ERROR,
               "\"failed: expected \" \"(0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", _kjCondition, 0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
               ,(char (*) [80])
                "failed: expected (0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,&_kjCondition_8.left,
               (uint *)&f);
  }
  if (reader.dataSize < 0x70) {
    sVar5 = 0;
  }
  else {
    sVar5 = *(short *)((long)reader.data + 0xc);
  }
  _kjCondition.left._0_6_ = CONCAT24(sVar5,0x3031);
  _kjCondition.right = (unsigned_long)anon_var_dwarf_a914;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,sVar5 == 0x3031);
  if ((sVar5 != 0x3031) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_8.left = 0x3031;
    if (reader.dataSize < 0x70) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(undefined2 *)((long)reader.data + 0xc);
    }
    f.exception._0_2_ = uVar6;
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xec,ERROR,
               "\"failed: expected \" \"(0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))\", _kjCondition, 0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,&_kjCondition_8.left,
               (unsigned_short *)&f);
  }
  if (reader.dataSize < 0x78) {
    cVar3 = '\0';
  }
  else {
    cVar3 = *(char *)((long)reader.data + 0xe);
  }
  _kjCondition.left._0_5_ = CONCAT14(cVar3,0x40);
  _kjCondition.right = (unsigned_long)anon_var_dwarf_a914;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar3 == '@');
  if ((cVar3 != '@') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_8.left = 0x40;
    if (reader.dataSize < 0x78) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined1 *)((long)reader.data + 0xe);
    }
    f.exception._0_1_ = uVar4;
    kj::_::Debug::
    log<char_const(&)[74],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"(0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))\", _kjCondition, 0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS)"
               ,(char (*) [74])
                "failed: expected (0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,&_kjCondition_8.left,
               (uchar *)&f);
  }
  if (reader.dataSize < 0x79) {
LAB_00131eba:
    _kjCondition.left = _kjCondition.left & 0xffffffffffffff00;
    if (kj::_::Debug::minSeverity < 3) {
LAB_00131ec8:
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(122 * ELEMENTS)\", _kjCondition"
                 ,(char (*) [59])"failed: expected reader.getDataField<bool>(122 * ELEMENTS)",
                 (DebugExpression<bool> *)&_kjCondition);
      goto LAB_00131ef1;
    }
LAB_00131f65:
    _kjCondition.left = _kjCondition.left & 0xffffffffffffff00;
    if (kj::_::Debug::minSeverity < 3) {
LAB_00131f6f:
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(124 * ELEMENTS)\", _kjCondition"
                 ,(char (*) [59])"failed: expected reader.getDataField<bool>(124 * ELEMENTS)",
                 (DebugExpression<bool> *)&_kjCondition);
      goto LAB_00131f98;
    }
LAB_00131fbb:
    _kjCondition.left = _kjCondition.left & 0xffffffffffffff00;
    if (2 < kj::_::Debug::minSeverity) goto LAB_00132092;
LAB_00131fca:
    kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf3,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(125 * ELEMENTS)\", _kjCondition",
               (char (*) [59])"failed: expected reader.getDataField<bool>(125 * ELEMENTS)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  else {
    _kjCondition.left =
         CONCAT71(_kjCondition.left._1_7_,*(byte *)((long)reader.data + 0xf)) & 0xffffffffffffff01 ^
         1;
    if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)reader.data + 0xf) & 1) == 1) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(120 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(120 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kjCondition);
    }
    if (reader.dataSize == 0x79) goto LAB_00131eba;
    bVar8 = (*(byte *)((long)reader.data + 0xf) & 2) >> 1;
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar8) ^ 1;
    if ((kj::_::Debug::minSeverity < 3 & bVar8) == 1) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(121 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(121 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kjCondition);
    }
    if (reader.dataSize < 0x7b) goto LAB_00131eba;
    bVar8 = *(byte *)((long)reader.data + 0xf) & 4;
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar8 >> 2);
    if (kj::_::Debug::minSeverity < 3 && bVar8 == 0) goto LAB_00131ec8;
LAB_00131ef1:
    if (reader.dataSize < 0x7c) goto LAB_00131f65;
    bVar8 = (*(byte *)((long)reader.data + 0xf) & 8) >> 3;
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar8) ^ 1;
    if ((kj::_::Debug::minSeverity < 3 & bVar8) == 1) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(123 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(123 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kjCondition);
    }
    if (reader.dataSize == 0x7c) goto LAB_00131f65;
    bVar8 = *(byte *)((long)reader.data + 0xf) & 0x10;
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar8 >> 4);
    if (kj::_::Debug::minSeverity < 3 && bVar8 == 0) goto LAB_00131f6f;
LAB_00131f98:
    if (reader.dataSize < 0x7e) goto LAB_00131fbb;
    _kjCondition.left =
         CONCAT71(_kjCondition.left._1_7_,(*(byte *)((long)reader.data + 0xf) & 0x20) >> 5);
    if (((*(byte *)((long)reader.data + 0xf) & 0x20) == 0) && (kj::_::Debug::minSeverity < 3))
    goto LAB_00131fca;
  }
  if (reader.dataSize < 0x7f) {
    _kjCondition.left = (ulong)_kjCondition.left._1_7_ << 8;
    if (2 < kj::_::Debug::minSeverity) goto LAB_00132092;
LAB_00132023:
    kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(126 * ELEMENTS)\", _kjCondition",
               (char (*) [59])"failed: expected reader.getDataField<bool>(126 * ELEMENTS)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  else {
    _kjCondition.left =
         CONCAT71(_kjCondition.left._1_7_,(*(byte *)((long)reader.data + 0xf) & 0x40) >> 6);
    if (((*(byte *)((long)reader.data + 0xf) & 0x40) == 0) && (kj::_::Debug::minSeverity < 3))
    goto LAB_00132023;
  }
  if (0x7f < reader.dataSize) {
    bVar14 = -1 < *(char *)((long)reader.data + 0xf);
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar14);
    if ((!bVar14) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[62],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(127 * ELEMENTS))\", _kjCondition"
                 ,(char (*) [62])"failed: expected !(reader.getDataField<bool>(127 * ELEMENTS))",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
LAB_00132092:
  if (reader.pointerCount == 0) {
    _kjCondition_8.left = 0;
    _kjCondition_8.right = 0;
    _kjCondition_8.op.content.ptr = (char *)0x0;
    _kjCondition_8.op.content.size_ = 0;
    _kjCondition_8._24_4_ = 0x7fffffff;
  }
  else {
    _kjCondition_8._0_8_ = reader.segment;
    _kjCondition_8.op.content.ptr = (char *)reader.capTable;
    _kjCondition_8.op.content.size_ = (size_t)reader.pointers;
    _kjCondition_8._24_4_ = reader.nestingLimit;
  }
  PointerReader::getStruct
            ((StructReader *)&_kjCondition,(PointerReader *)&_kjCondition_8,
             (word *)(anonymous_namespace)::SUBSTRUCT_DEFAULT);
  _kjCondition_8.right = 0;
  if (0x1f < (uint)_kjCondition._32_4_) {
    _kjCondition_8.right = *(uint *)_kjCondition.op.content.ptr;
  }
  _kjCondition_8.left = 0x7b;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  _kjCondition_8.result = _kjCondition_8.right == 0x7b;
  if ((_kjCondition_8.right != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_15.left = 0;
    f.exception._0_4_ = 0x7b;
    if (0x1f < (uint)_kjCondition._32_4_) {
      _kjCondition_15.left = *(int *)_kjCondition.op.content.ptr;
    }
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xfa,ERROR,
               "\"failed: expected \" \"(123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))\", _kjCondition, 123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))",
               &_kjCondition_8,(uint *)&f,(uint *)&_kjCondition_15);
  }
  if (reader.pointerCount < 2) {
    _kjCondition_8.left = 0;
    _kjCondition_8.right = 0;
    _kjCondition_8.op.content.ptr = (char *)0x0;
    _kjCondition_8.op.content.size_ = 0;
    _kjCondition_8._24_4_ = 0x7fffffff;
  }
  else {
    _kjCondition_8.op.content.size_ = (size_t)(reader.pointers + 1);
    _kjCondition_8._0_8_ = reader.segment;
    _kjCondition_8.op.content.ptr = (char *)reader.capTable;
    _kjCondition_8._24_4_ = reader.nestingLimit;
  }
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_8,FOUR_BYTES,(word *)0x0);
  _kjCondition_8.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_8.left = 3;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  _kjCondition_8.result = (uint)_kjCondition.op.content.size_ == 3;
  if ((uint)_kjCondition.op.content.size_ != 3) {
    _kjCondition_15.left = 3;
    local_78.segment =
         (SegmentReader *)CONCAT44(local_78.segment._4_4_,(uint)_kjCondition.op.content.size_);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xff,FAILED,"(3 * ELEMENTS) == (list.size())",
               "_kjCondition,3 * ELEMENTS, list.size()",&_kjCondition_8,(uint *)&_kjCondition_15,
               (uint *)&local_78);
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition_8.result = *(uint *)_kjCondition.op.content.ptr == 200;
  _kjCondition_8.right = *(uint *)_kjCondition.op.content.ptr;
  _kjCondition_8.left = 200;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_8.result) {
    f.exception._0_4_ = 200;
    _kjCondition_15.left = *(int *)_kjCondition.op.content.ptr;
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x100,ERROR,
               "\"failed: expected \" \"(200) == (list.getDataElement<int32_t>(0 * ELEMENTS))\", _kjCondition, 200, list.getDataElement<int32_t>(0 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (200) == (list.getDataElement<int32_t>(0 * ELEMENTS))",
               (DebugComparison<int,_int> *)&_kjCondition_8,(int *)&f,&_kjCondition_15.left);
  }
  _kjCondition_8.result =
       *(uint *)(_kjCondition.op.content.ptr + (_kjCondition.op.content.size_._4_4_ >> 3)) == 0xc9;
  _kjCondition_8.right =
       *(uint *)(_kjCondition.op.content.ptr + (_kjCondition.op.content.size_._4_4_ >> 3));
  _kjCondition_8.left = 0xc9;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_8.result) {
    f.exception._0_4_ = 0xc9;
    _kjCondition_15.left =
         *(int *)(_kjCondition.op.content.ptr + (_kjCondition.op.content.size_._4_4_ >> 3));
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x101,ERROR,
               "\"failed: expected \" \"(201) == (list.getDataElement<int32_t>(1 * ELEMENTS))\", _kjCondition, 201, list.getDataElement<int32_t>(1 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (201) == (list.getDataElement<int32_t>(1 * ELEMENTS))",
               (DebugComparison<int,_int> *)&_kjCondition_8,(int *)&f,&_kjCondition_15.left);
  }
  _kjCondition_8.right =
       *(uint *)(_kjCondition.op.content.ptr + (_kjCondition.op.content.size_._4_4_ >> 2));
  _kjCondition_8.left = 0xca;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  _kjCondition_8.result = _kjCondition_8.right == 0xca;
  if ((_kjCondition_8.right != 0xca) && (kj::_::Debug::minSeverity < 3)) {
    f.exception._0_4_ = 0xca;
    _kjCondition_15.left =
         *(int *)(_kjCondition.op.content.ptr + (_kjCondition.op.content.size_._4_4_ >> 2));
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x102,ERROR,
               "\"failed: expected \" \"(202) == (list.getDataElement<int32_t>(2 * ELEMENTS))\", _kjCondition, 202, list.getDataElement<int32_t>(2 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (202) == (list.getDataElement<int32_t>(2 * ELEMENTS))",
               (DebugComparison<int,_int> *)&_kjCondition_8,(int *)&f,&_kjCondition_15.left);
  }
  if (reader.pointerCount < 3) {
    _kjCondition_8.left = 0;
    _kjCondition_8.right = 0;
    _kjCondition_8.op.content.ptr = (char *)0x0;
    _kjCondition_8.op.content.size_ = 0;
    _kjCondition_8._24_4_ = 0x7fffffff;
  }
  else {
    _kjCondition_8.op.content.size_ = (size_t)(reader.pointers + 2);
    _kjCondition_8._0_8_ = reader.segment;
    _kjCondition_8.op.content.ptr = (char *)reader.capTable;
    _kjCondition_8._24_4_ = reader.nestingLimit;
  }
  local_aa = reader.pointerCount;
  index = 0;
  PointerReader::getList
            ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_8,INLINE_COMPOSITE,
             (word *)0x0);
  _kjCondition_8.right = (uint)_kjCondition.op.content.size_;
  _kjCondition_8.left = 4;
  _kjCondition_8.op.content.ptr = " == ";
  _kjCondition_8.op.content.size_ = 5;
  _kjCondition_8.result = (uint)_kjCondition.op.content.size_ == 4;
  if ((uint)_kjCondition.op.content.size_ == 4) {
    do {
      ListReader::getStructElement
                ((StructReader *)&_kjCondition_8,(ListReader *)&_kjCondition,index);
      f.exception._4_4_ = 0;
      if (0x1f < local_f8) {
        f.exception._4_4_ = *(int *)_kjCondition_8.op.content.size_;
      }
      f.exception._0_4_ = index + 300;
      if (((int)f.exception != f.exception._4_4_) && (kj::_::Debug::minSeverity < 3)) {
        uVar9 = 0;
        if (0x1f < local_f8) {
          uVar9 = *(undefined4 *)_kjCondition_8.op.content.size_;
        }
        local_78.segment = (SegmentReader *)CONCAT44(local_78.segment._4_4_,uVar9);
        _kjCondition_15.left = (int)f.exception;
        kj::_::Debug::log<char_const(&)[76],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x10b,ERROR,
                   "\"failed: expected \" \"(300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))\", _kjCondition, 300 + i, element.getDataField<int32_t>(0 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))",
                   (DebugComparison<int,_int> *)&f,&_kjCondition_15.left,(int *)&local_78);
      }
      if (local_f4 == 0) {
        local_78.segment = (SegmentReader *)0x0;
        local_78.capTable = (CapTableReader *)0x0;
        local_78.pointer = (WirePointer *)0x0;
        local_78.nestingLimit = 0x7fffffff;
      }
      else {
        local_78.pointer = (WirePointer *)CONCAT44(_kjCondition_8._28_4_,_kjCondition_8._24_4_);
        local_78.segment = (SegmentReader *)_kjCondition_8._0_8_;
        local_78.capTable = (CapTableReader *)_kjCondition_8.op.content.ptr;
        local_78.nestingLimit = local_f0;
      }
      PointerReader::getStruct
                ((StructReader *)&f,&local_78,
                 (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
      _kjCondition_15.right = 0;
      if (0x1f < local_88) {
        _kjCondition_15.right = _DAT_00000005;
      }
      _kjCondition_15.left = index + 400;
      _kjCondition_15.op.content.ptr = " == ";
      _kjCondition_15.op.content.size_ = 5;
      _kjCondition_15.result = _kjCondition_15.left == _kjCondition_15.right;
      if ((!_kjCondition_15.result) && (kj::_::Debug::minSeverity < 3)) {
        if (local_f4 == 0) {
          local_78.segment = (SegmentReader *)0x0;
          local_78.capTable = (CapTableReader *)0x0;
          local_78.pointer = (WirePointer *)0x0;
          local_78.nestingLimit = 0x7fffffff;
        }
        else {
          local_78.pointer = (WirePointer *)CONCAT44(_kjCondition_8._28_4_,_kjCondition_8._24_4_);
          local_78.segment = (SegmentReader *)_kjCondition_8._0_8_;
          local_78.capTable = (CapTableReader *)_kjCondition_8.op.content.ptr;
          local_78.nestingLimit = local_f0;
        }
        local_b0 = _kjCondition_15.left;
        PointerReader::getStruct
                  ((StructReader *)&f,&local_78,
                   (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
        local_34 = 0;
        if (0x1f < local_88) {
          local_34 = _DAT_00000005;
        }
        kj::_::Debug::log<char_const(&)[162],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x10f,ERROR,
                   "\"failed: expected \" \"(400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))\", _kjCondition, 400 + i, element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS)"
                   ,(char (*) [162])
                    "failed: expected (400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))"
                   ,&_kjCondition_15,(int *)&local_b0,(int *)&local_34);
      }
      index = index + 1;
    } while (index != 4);
    if (local_aa < 4) {
      _kjCondition_8.left = 0;
      _kjCondition_8.right = 0;
      _kjCondition_8.op.content.ptr = (char *)0x0;
      _kjCondition_8.op.content.size_ = 0;
      reader.nestingLimit = 0x7fffffff;
    }
    else {
      _kjCondition_8.op.content.size_ = (size_t)(reader.pointers + 3);
      _kjCondition_8._0_8_ = reader.segment;
      _kjCondition_8.op.content.ptr = (char *)reader.capTable;
    }
    _kjCondition_8._24_4_ = reader.nestingLimit;
    PointerReader::getList
              ((ListReader *)&_kjCondition,(PointerReader *)&_kjCondition_8,POINTER,(word *)0x0);
    _kjCondition_8.right = (uint)_kjCondition.op.content.size_;
    _kjCondition_8.left = 5;
    _kjCondition_8.op.content.ptr = " == ";
    _kjCondition_8.op.content.size_ = 5;
    _kjCondition_8.result = (uint)_kjCondition.op.content.size_ == 5;
    if ((uint)_kjCondition.op.content.size_ != 5) {
      _kjCondition_15.left = 5;
      local_78.segment =
           (SegmentReader *)CONCAT44(local_78.segment._4_4_,(uint)_kjCondition.op.content.size_);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x115,FAILED,"(5 * ELEMENTS) == (list.size())",
                 "_kjCondition,5 * ELEMENTS, list.size()",&_kjCondition_8,(uint *)&_kjCondition_15,
                 (uint *)&local_78);
      kj::_::Debug::Fault::fatal(&f);
    }
    lVar11 = -1;
    uVar12 = 0;
    do {
      f.exception = (Exception *)_kjCondition.left;
      PointerReader::getList
                ((ListReader *)&_kjCondition_8,(PointerReader *)&f,TWO_BYTES,(word *)0x0);
      uVar12 = uVar12 + 1;
      f.exception = (Exception *)CONCAT44(_kjCondition_8._24_4_,(int)uVar12);
      if (uVar12 != (uint)_kjCondition_8._24_4_) {
        local_78.segment = (SegmentReader *)CONCAT44(local_78.segment._4_4_,(int)uVar12);
        local_b0 = _kjCondition_8._24_4_;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ((Fault *)&_kjCondition_15,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x119,FAILED,"((i + 1) * ELEMENTS) == (element.size())",
                   "_kjCondition,(i + 1) * ELEMENTS, element.size()",
                   (DebugComparison<unsigned_int,_unsigned_int> *)&f,(uint *)&local_78,&local_b0);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_15);
      }
      uVar13 = 500;
      iVar7 = kj::_::Debug::minSeverity;
      do {
        uVar10 = (ulong)(uint)_kjCondition_8._28_4_ * (uVar13 - 500) >> 3;
        uVar2 = *(ushort *)(_kjCondition_8.op.content.size_ + uVar10);
        f.exception._4_2_ = uVar2;
        f.exception._0_4_ = (int)uVar13;
        if ((uVar13 != uVar2) && (iVar7 < 3)) {
          local_78.segment =
               (SegmentReader *)
               CONCAT62(local_78.segment._2_6_,
                        *(undefined2 *)(_kjCondition_8.op.content.size_ + uVar10));
          _kjCondition_15.left = (int)uVar13;
          kj::_::Debug::
          log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0x11b,ERROR,
                     "\"failed: expected \" \"(500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))\", _kjCondition, 500u + j, element.getDataElement<uint16_t>(j * ELEMENTS)"
                     ,(char (*) [80])
                      "failed: expected (500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))"
                     ,(DebugComparison<unsigned_int,_unsigned_short> *)&f,(uint *)&_kjCondition_15,
                     (unsigned_short *)&local_78);
          iVar7 = kj::_::Debug::minSeverity;
        }
        lVar1 = lVar11 + uVar13;
        uVar13 = uVar13 + 1;
      } while (lVar1 != 499);
      lVar11 = lVar11 + -1;
    } while (uVar12 != 5);
    return;
  }
  _kjCondition_15.left = 4;
  local_78.segment =
       (SegmentReader *)CONCAT44(local_78.segment._4_4_,(uint)_kjCondition.op.content.size_);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x108,FAILED,"(4 * ELEMENTS) == (list.size())",
             "_kjCondition,4 * ELEMENTS, list.size()",&_kjCondition_8,(uint *)&_kjCondition_15,
             (uint *)&local_78);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static void checkStruct(StructReader reader) {
  EXPECT_EQ(0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS));
  EXPECT_EQ(0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(120 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(121 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(122 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(123 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(124 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(125 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(126 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(127 * ELEMENTS));

  {
    StructReader subStruct = reader.getPointerField(0 * POINTERS)
                                   .getStruct(SUBSTRUCT_DEFAULT.words);
    EXPECT_EQ(123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(1 * POINTERS).getList(ElementSize::FOUR_BYTES, nullptr);
    ASSERT_EQ(3 * ELEMENTS, list.size());
    EXPECT_EQ(200, list.getDataElement<int32_t>(0 * ELEMENTS));
    EXPECT_EQ(201, list.getDataElement<int32_t>(1 * ELEMENTS));
    EXPECT_EQ(202, list.getDataElement<int32_t>(2 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(2 * POINTERS)
                            .getList(ElementSize::INLINE_COMPOSITE, nullptr);
    ASSERT_EQ(4 * ELEMENTS, list.size());
    for (int i = 0; i < 4; i++) {
      StructReader element = list.getStructElement(i * ELEMENTS);
      EXPECT_EQ(300 + i, element.getDataField<int32_t>(0 * ELEMENTS));
      EXPECT_EQ(400 + i,
          element.getPointerField(0 * POINTERS)
                 .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words)
                 .getDataField<int32_t>(0 * ELEMENTS));
    }
  }

  {
    ListReader list = reader.getPointerField(3 * POINTERS).getList(ElementSize::POINTER, nullptr);
    ASSERT_EQ(5 * ELEMENTS, list.size());
    for (uint i = 0; i < 5; i++) {
      ListReader element = list.getPointerElement(i * ELEMENTS)
                               .getList(ElementSize::TWO_BYTES, nullptr);
      ASSERT_EQ((i + 1) * ELEMENTS, element.size());
      for (uint j = 0; j <= i; j++) {
        EXPECT_EQ(500u + j, element.getDataElement<uint16_t>(j * ELEMENTS));
      }
    }
  }
}